

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::cast_to_variable_store
          (CompilerMSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  uint uVar1;
  Variant *pVVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  uint32_t uVar6;
  SPIRVariable *var;
  SPIRType *parent_type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  BaseType BVar8;
  char (*in_R9) [2];
  uint32_t uVar9;
  SPIRType short_type;
  undefined7 in_stack_fffffffffffffe08;
  SPIRExpression *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  string local_1b8;
  SPIRType *local_198;
  undefined1 local_190 [20];
  uint32_t local_17c;
  ulong local_178;
  uint *local_170;
  size_t local_168;
  uint local_158 [8];
  bool *local_138;
  size_t local_130;
  bool local_120 [40];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  uVar3 = (ulong)target_id;
  bVar4 = Compiler::has_extended_decoration
                    ((Compiler *)this,target_id,SPIRVCrossDecorationPhysicalTypePacked);
  if ((uVar3 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar3].type == TypeExpression)) {
    local_1e0 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar3);
  }
  else {
    local_1e0 = (SPIRExpression *)0x0;
  }
  var = Compiler::maybe_get_backing_variable((Compiler *)this,target_id);
  uVar6 = Compiler::get_extended_decoration
                    ((Compiler *)this,target_id,SPIRVCrossDecorationPhysicalTypeID);
  local_198 = expr_type;
  if (uVar6 != 0) {
    local_198 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar6);
  }
  if (var == (SPIRVariable *)0x0) {
    parent_type = (SPIRType *)0x0;
  }
  else {
    target_id = (var->super_IVariant).self.id;
    parent_type = Compiler::get_variable_data_type((Compiler *)this,var);
    if ((expr_type->basetype == Boolean) &&
       ((var->storage == StorageClassWorkgroup || (parent_type->basetype == Struct)))) {
      bVar5 = Compiler::is_array((Compiler *)this,expr_type);
      if (bVar5) {
        CompilerGLSL::to_rerolled_array_expression
                  ((string *)local_190,&this->super_CompilerGLSL,parent_type,expr,expr_type);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
      }
      else {
        SPIRType::SPIRType((SPIRType *)local_190,expr_type);
        local_190._16_4_ = Short;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_1d8,this,(SPIRType *)local_190,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1b8,(spirv_cross *)local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (local_1d8[0] != &local_1c8) {
          operator_delete(local_1d8[0]);
        }
        local_190._0_8_ = &PTR__SPIRType_00360128;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_68);
        local_b8 = 0;
        if (local_c0 != local_a8) {
          free(local_c0);
        }
        local_f0 = 0;
        if (local_f8 != local_e0) {
          free(local_f8);
        }
        local_130 = 0;
        if (local_138 != local_120) {
          free(local_138);
        }
        local_168 = 0;
        if (local_170 != local_158) {
          free(local_170);
        }
      }
    }
  }
  if ((var != (SPIRVariable *)0x0) && ((this->msl_options).msl_version < 30000)) {
    if (var->storage == StorageClassWorkgroup) {
      uVar1 = expr_type->columns;
    }
    else {
      if (((parent_type->basetype != Struct) ||
          (bVar5 = Compiler::has_extended_decoration
                             ((Compiler *)this,(parent_type->super_IVariant).self.id,
                              SPIRVCrossDecorationWorkgroupStruct), !bVar5)) ||
         (bVar4 = bVar4 ^ 1, bVar4 == 0)) goto LAB_0023b995;
      uVar1 = expr_type->columns;
    }
    if (1 < uVar1) {
      SPIRType::SPIRType((SPIRType *)local_190,local_198);
      if ((local_1e0 != (SPIRExpression *)0x0) && (local_1e0->need_transpose == true)) {
        local_178 = local_178 << 0x20 | local_178 >> 0x20;
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_1d8,this,local_190,0);
      in_R9 = (char (*) [2])0x2bd856;
      join<char_const(&)[12],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1b8,(spirv_cross *)"spvStorage_",(char (*) [12])local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
                 (char (*) [2])expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
                 (char (*) [2])CONCAT17(bVar4,in_stack_fffffffffffffe08));
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if (local_1d8[0] != &local_1c8) {
        operator_delete(local_1d8[0]);
      }
      local_190._0_8_ = &PTR__SPIRType_00360128;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_130 = 0;
      if (local_138 != local_120) {
        free(local_138);
      }
      local_168 = 0;
      if (local_170 != local_158) {
        free(local_170);
      }
    }
  }
LAB_0023b995:
  bVar5 = Compiler::has_decoration((Compiler *)this,(ID)target_id,DecorationBuiltIn);
  if (!bVar5) {
    return;
  }
  uVar6 = Compiler::get_decoration((Compiler *)this,(ID)target_id,DecorationBuiltIn);
  if (uVar6 < 0xd) {
    if ((0x680U >> (uVar6 & 0x1f) & 1) == 0) {
      if ((0x1800U >> (uVar6 & 0x1f) & 1) != 0) {
        BVar8 = Half;
        uVar9 = 0x10;
        goto LAB_0023ba07;
      }
      goto LAB_0023b9e9;
    }
  }
  else {
LAB_0023b9e9:
    if ((uVar6 != 0x1396) &&
       (BVar8 = expr_type->basetype, uVar9 = expr_type->width, uVar6 != 0x1158)) goto LAB_0023ba07;
  }
  uVar9 = 0x20;
  BVar8 = UInt;
LAB_0023ba07:
  if (BVar8 != expr_type->basetype) {
    if (uVar9 == expr_type->width) {
      SPIRType::SPIRType((SPIRType *)local_190,expr_type);
      local_190._16_4_ = BVar8;
      CompilerGLSL::bitcast_expression
                (&local_1b8,&this->super_CompilerGLSL,(SPIRType *)local_190,expr_type->basetype,expr
                );
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
      paVar7 = &local_1b8.field_2;
    }
    else {
      SPIRType::SPIRType((SPIRType *)local_190,expr_type);
      local_190._16_4_ = BVar8;
      local_17c = uVar9;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_1d8,this,(SPIRType *)local_190,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1b8,(spirv_cross *)local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
                 (char (*) [2])expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,in_R9
                );
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      paVar7 = &local_1c8;
      local_1b8._M_dataplus._M_p = (pointer)local_1d8[0];
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar7) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_190._0_8_ = &PTR__SPIRType_00360128;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_130 = 0;
    if (local_138 != local_120) {
      free(local_138);
    }
    local_168 = 0;
    if (local_170 != local_158) {
      free(local_170);
    }
  }
  return;
}

Assistant:

void CompilerMSL::cast_to_variable_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	bool is_packed = has_extended_decoration(target_id, SPIRVCrossDecorationPhysicalTypePacked);
	auto *target_expr = maybe_get<SPIRExpression>(target_id);
	auto *var = maybe_get_backing_variable(target_id);
	const SPIRType *var_type = nullptr, *phys_type = nullptr;

	if (uint32_t phys_id = get_extended_decoration(target_id, SPIRVCrossDecorationPhysicalTypeID))
		phys_type = &get<SPIRType>(phys_id);
	else
		phys_type = &expr_type;

	if (var)
	{
		target_id = var->self;
		var_type = &get_variable_data_type(*var);
	}

	bool rewrite_boolean_store =
		expr_type.basetype == SPIRType::Boolean &&
		(var && (var->storage == StorageClassWorkgroup || var_type->basetype == SPIRType::Struct));

	// Type fixups for workgroup variables or struct members if they are booleans.
	if (rewrite_boolean_store)
	{
		if (is_array(expr_type))
		{
			expr = to_rerolled_array_expression(*var_type, expr, expr_type);
		}
		else
		{
			auto short_type = expr_type;
			short_type.basetype = SPIRType::Short;
			expr = join(type_to_glsl(short_type), "(", expr, ")");
		}
	}

	// Type fixups for workgroup variables if they are matrices.
	// Don't do fixup for packed types; those are handled specially.
	// FIXME: Maybe use a type like spvStorageMatrix for packed matrices?
	if (!msl_options.supports_msl_version(3, 0) && var &&
	    (var->storage == StorageClassWorkgroup ||
	     (var_type->basetype == SPIRType::Struct &&
	      has_extended_decoration(var_type->self, SPIRVCrossDecorationWorkgroupStruct) && !is_packed)) &&
	    expr_type.columns > 1)
	{
		SPIRType matrix_type = *phys_type;
		if (target_expr && target_expr->need_transpose)
			swap(matrix_type.vecsize, matrix_type.columns);
		expr = join("spvStorage_", type_to_glsl(matrix_type), "(", expr, ")");
	}

	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;
	auto expected_width = expr_type.width;
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInPrimitiveId:
	case BuiltInViewIndex:
		expected_type = SPIRType::UInt;
		expected_width = 32;
		break;

	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		expected_type = SPIRType::Half;
		expected_width = 16;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
	{
		if (expected_width != expr_type.width)
		{
			// These are of different widths, so we cannot do a straight bitcast.
			auto type = expr_type;
			type.basetype = expected_type;
			type.width = expected_width;
			expr = join(type_to_glsl(type), "(", expr, ")");
		}
		else
		{
			auto type = expr_type;
			type.basetype = expected_type;
			expr = bitcast_expression(type, expr_type.basetype, expr);
		}
	}
}